

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.cpp
# Opt level: O0

void __thiscall GPIO::GPIOBase::SoftThread::run_pwm(SoftThread *this)

{
  __int_type_conflict1 _Var1;
  __int_type_conflict1 _Var2;
  long in_RDI;
  uint local_space;
  uint local_mark;
  duration<long,_std::ratio<1L,_1000000L>_> in_stack_ffffffffffffffe0;
  duration<long,_std::ratio<1L,_1000000L>_> in_stack_ffffffffffffffe8;
  
  while( true ) {
    _Var1 = std::__atomic_base::operator_cast_to_unsigned_int
                      ((__atomic_base<unsigned_int> *)in_stack_ffffffffffffffe8.__r);
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_int
                      ((__atomic_base<unsigned_int> *)in_stack_ffffffffffffffe8.__r);
    if ((_Var1 == 0) && (_Var2 == 0)) break;
    if (_Var1 != 0) {
      int_set(*(uint *)(in_RDI + 0x18));
      in_stack_ffffffffffffffe8 =
           std::chrono::operator*(in_stack_ffffffffffffffe8.__r,in_stack_ffffffffffffffe0.__r);
      std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>
                ((duration<long,_std::ratio<1L,_1000000L>_> *)this);
    }
    if (_Var2 != 0) {
      int_clear(*(uint *)(in_RDI + 0x18));
      in_stack_ffffffffffffffe0 =
           std::chrono::operator*(in_stack_ffffffffffffffe8.__r,in_stack_ffffffffffffffe0.__r);
      std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>
                ((duration<long,_std::ratio<1L,_1000000L>_> *)this);
    }
  }
  return;
}

Assistant:

void GPIOBase::SoftThread::run_pwm()
{
    static const std::chrono::microseconds base_period = std::chrono::microseconds(100);
    
    for (;;) {
        unsigned int local_mark = m_mark;
        unsigned int local_space = m_space;

        // terminate?

        if (local_mark == 0 && local_space == 0) return;
        if (local_mark != 0) {
            int_set(m_gpio);
            std::this_thread::sleep_for(base_period * local_mark);
        }
        if (local_space != 0) {
            int_clear(m_gpio);
            std::this_thread::sleep_for(base_period * local_space);
        }
    }
}